

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i2p.cpp
# Opt level: O2

string * i2p::SwapBase64(string *__return_storage_ptr__,string *from)

{
  long lVar1;
  size_t i;
  ulong uVar2;
  char cVar3;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::resize
            (__return_storage_ptr__,from->_M_string_length);
  for (uVar2 = 0; uVar2 < from->_M_string_length; uVar2 = uVar2 + 1) {
    cVar3 = (from->_M_dataplus)._M_p[uVar2];
    if (cVar3 == '+') {
      cVar3 = '-';
    }
    else if (cVar3 == '-') {
      cVar3 = '+';
    }
    else if (cVar3 == '/') {
      cVar3 = '~';
    }
    else if (cVar3 == '~') {
      cVar3 = '/';
    }
    (__return_storage_ptr__->_M_dataplus)._M_p[uVar2] = cVar3;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

static std::string SwapBase64(const std::string& from)
{
    std::string to;
    to.resize(from.size());
    for (size_t i = 0; i < from.size(); ++i) {
        switch (from[i]) {
        case '-':
            to[i] = '+';
            break;
        case '~':
            to[i] = '/';
            break;
        case '+':
            to[i] = '-';
            break;
        case '/':
            to[i] = '~';
            break;
        default:
            to[i] = from[i];
            break;
        }
    }
    return to;
}